

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeStructType(Builder *this,Vector<Id> *members,char *name)

{
  int iVar1;
  Id IVar2;
  Instruction *pIVar3;
  size_type sVar4;
  const_reference pvVar5;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_40;
  int local_38;
  int op;
  Instruction *local_28;
  Instruction *type;
  char *name_local;
  Vector<Id> *members_local;
  Builder *this_local;
  
  type = (Instruction *)name;
  name_local = (char *)members;
  members_local = (Vector<Id> *)this;
  pIVar3 = (Instruction *)Instruction::operator_new((Instruction *)0x38,(size_t)members);
  IVar2 = getUniqueId(this);
  Instruction::Instruction(pIVar3,IVar2,0,OpTypeStruct);
  local_38 = 0;
  local_28 = pIVar3;
  while( true ) {
    iVar1 = local_38;
    sVar4 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                       name_local);
    pIVar3 = local_28;
    if ((int)sVar4 <= iVar1) break;
    pvVar5 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                        name_local,(long)local_38);
    Instruction::addIdOperand(pIVar3,*pvVar5);
    local_38 = local_38 + 1;
  }
  std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::push_back
            (this->groupedTypes + 0x1e,&local_28);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_40,
             local_28);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->constantsTypesGlobals,(value_type *)&local_40);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_40);
  Module::mapInstruction(&this->module,local_28);
  IVar2 = Instruction::getResultId(local_28);
  addName(this,IVar2,(char *)type);
  IVar2 = Instruction::getResultId(local_28);
  return IVar2;
}

Assistant:

Id Builder::makeStructType(const dxil_spv::Vector<Id>& members, const char* name)
{
    // Don't look for previous one, because in the general case,
    // structs can be duplicated except for decorations.

    // not found, make it
    Instruction* type = new Instruction(getUniqueId(), NoType, OpTypeStruct);
    for (int op = 0; op < (int)members.size(); ++op)
        type->addIdOperand(members[op]);
    groupedTypes[OpTypeStruct].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);
    addName(type->getResultId(), name);

    return type->getResultId();
}